

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_structure.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::
dump<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,database *db,
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *index,ostream *os,index_pointer node,uint shifts)

{
  hash_type hVar1;
  internal_node *piVar2;
  uint uVar3;
  address aVar4;
  ostream *poVar5;
  uint uVar6;
  internal_node *__range2;
  long lVar7;
  uint in_stack_fffffffffffffc18;
  index_pointer local_3d0 [4];
  index_pointer node_local;
  internal_node *ptr;
  value_type kvp;
  string local_360;
  string local_340;
  ostringstream key_stream;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_318 [46];
  ostringstream value_stream;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1a0 [46];
  
  node_local = (index_pointer)index;
  if (((ulong)index & 1) == 0) {
    if (((ulong)index & 2) != 0) {
      pstore::assert_failed
                ("node.is_address ()",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                 ,0x89);
    }
    aVar4 = pstore::index::details::index_pointer::to_address((index_pointer *)&node_local.addr_);
    std::__cxx11::to_string((string *)&key_stream,aVar4.a_);
    std::operator+(__return_storage_ptr__,"leaf",(string *)&key_stream);
    std::__cxx11::string::~string((string *)&key_stream);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::load_leaf_node(&kvp,(hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                           *)db,(database *)this,aVar4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&key_stream);
    pstore::operator<<((ostream *)&key_stream,&kvp.first);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&value_stream);
    pstore::operator<<((ostream *)&value_stream,&kvp.second);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)__return_storage_ptr__);
    poVar5 = std::operator<<(poVar5," [shape=record label=\"");
    std::__cxx11::stringbuf::str();
    anon_unknown.dwarf_1d241::escape((string *)&local_3d0[0].addr_,(string *)&ptr);
    poVar5 = std::operator<<(poVar5,(string *)&local_3d0[0].addr_);
    poVar5 = std::operator<<(poVar5,'|');
    std::__cxx11::stringbuf::str();
    anon_unknown.dwarf_1d241::escape(&local_340,&local_360);
    poVar5 = std::operator<<(poVar5,(string *)&local_340);
    std::operator<<(poVar5,"\"]\n");
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_3d0[0].addr_);
    std::__cxx11::string::~string((string *)&ptr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&value_stream);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&key_stream);
  }
  else {
    uVar6 = (uint)os;
    local_3d0[0] = (index_pointer)index;
    if (uVar6 < 0x42) {
      if (((ulong)index & 2) != 0) {
LAB_00108be7:
        pstore::assert_failed
                  ("!node.is_heap ()",
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                   ,0x74);
      }
      aVar4 = pstore::index::details::index_pointer::to_address
                        ((index_pointer *)&local_3d0[0].addr_);
      std::__cxx11::to_string((string *)&key_stream,aVar4.a_);
      std::operator+(__return_storage_ptr__,"internal",(string *)&key_stream);
      std::__cxx11::string::~string((string *)&key_stream);
      _value_stream = 0;
      a_Stack_1a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ptr = (internal_node *)0x0;
      pstore::index::details::internal_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                  *)&key_stream,(database *)this,local_3d0[0]);
      kvp.first.v_._0_8_ = &ptr;
      kvp.first.v_._8_8_ = &value_stream;
      std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
      operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&> *
                )&kvp,(pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                       *)&key_stream);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_318);
      piVar2 = ptr;
      if (ptr == (internal_node *)0x0) {
        pstore::assert_failed
                  ("ptr != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                   ,0x7b);
      }
      uVar3 = pstore::index::details::internal_node::size(ptr);
      for (lVar7 = 0; (ulong)uVar3 << 3 != lVar7; lVar7 = lVar7 + 8) {
        dump<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                  ((string *)&key_stream,this,db,
                   *(hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                     **)((long)piVar2->children_ + lVar7),(ostream *)(ulong)(uVar6 + 6),node,
                   in_stack_fffffffffffffc18);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)__return_storage_ptr__);
        poVar5 = std::operator<<(poVar5," -> ");
        poVar5 = std::operator<<(poVar5,(string *)&key_stream);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&key_stream);
      }
    }
    else {
      if (((ulong)index & 2) != 0) goto LAB_00108be7;
      aVar4 = pstore::index::details::index_pointer::to_address
                        ((index_pointer *)&local_3d0[0].addr_);
      std::__cxx11::to_string((string *)&key_stream,aVar4.a_);
      std::operator+(__return_storage_ptr__,"linear",(string *)&key_stream);
      std::__cxx11::string::~string((string *)&key_stream);
      _value_stream = 0;
      a_Stack_1a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ptr = (internal_node *)0x0;
      pstore::index::details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)&key_stream,(database *)this,local_3d0[0]);
      kvp.first.v_._0_8_ = &ptr;
      kvp.first.v_._8_8_ = &value_stream;
      std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::
      operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> *)
                &kvp,(pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                      *)&key_stream);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_318);
      piVar2 = ptr;
      if (ptr == (internal_node *)0x0) {
        pstore::assert_failed
                  ("ptr != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                   ,0x7b);
      }
      hVar1 = ptr->bitmap_;
      for (lVar7 = 0; hVar1 << 3 != lVar7; lVar7 = lVar7 + 8) {
        dump<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                  ((string *)&key_stream,this,db,
                   *(hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                     **)((long)piVar2->children_ + lVar7),(ostream *)(ulong)(uVar6 + 6),node,
                   in_stack_fffffffffffffc18);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)__return_storage_ptr__);
        poVar5 = std::operator<<(poVar5," -> ");
        poVar5 = std::operator<<(poVar5,(string *)&key_stream);
        std::operator<<(poVar5,";\n");
        std::__cxx11::string::~string((string *)&key_stream);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dump (pstore::database const & db, IndexType const & index, std::ostream & os,
                      index_pointer node, unsigned shifts) {
        if (node.is_leaf ()) {
            PSTORE_ASSERT (node.is_address ());
            return dump_leaf (db, index, os, node.to_address ());
        }
        return depth_is_internal_node (shifts)
                   ? dump_intermediate<internal_node> (db, index, os, node, shifts)
                   : dump_intermediate<linear_node> (db, index, os, node, shifts);
    }